

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_server.c
# Opt level: O2

void response_written(cio_http_client *client,cio_error err)

{
  cio_http_location_handler *pcVar1;
  void *pvVar2;
  code *UNRECOVERED_JUMPTABLE;
  size_t in_RDX;
  undefined4 in_register_00000034;
  
  if (err == CIO_SUCCESS) {
    pcVar1 = client->current_handler;
    pcVar1[4].on_host = (cio_http_data_cb_t)client;
    (*pcVar1[0xc].on_body)
              ((cio_http_client *)&pcVar1[3].on_body,(char *)CONCAT44(in_register_00000034,err),
               in_RDX);
    return;
  }
  pvVar2 = (client->parser).data;
  UNRECOVERED_JUMPTABLE = *(code **)((long)pvVar2 + 0xa8);
  if (UNRECOVERED_JUMPTABLE != (code *)0x0) {
    (*UNRECOVERED_JUMPTABLE)(pvVar2,"error while writing http upgrade response");
    return;
  }
  return;
}

Assistant:

static void response_written(struct cio_buffered_stream *buffered_stream, void *handler_context, enum cio_error err)
{
	(void)buffered_stream;
	struct cio_http_client *client = (struct cio_http_client *)handler_context;
	enum cio_error cancel_err = cio_timer_cancel(&client->http_private.response_timer);

	client->http_private.response_written_completed = true;

	if (client->response_written_cb) {
		client->response_written_cb(client, err);
	}

	if (cio_unlikely(cancel_err != CIO_SUCCESS)) {
		handle_server_error(client, "Cancelling response timer failed!");
		return;
	}

	if (cio_unlikely(err != CIO_SUCCESS)) {
		handle_server_error(client, "Writing response failed!");
		return;
	}

	if (cio_unlikely(client->http_private.close_immediately || !client->http_private.should_keepalive)) {
		mark_to_be_closed(client);
		return;
	}

	restart_read_request(client);
}